

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.c++
# Opt level: O2

size_t __thiscall
capnp::expectedSizeInWordsFromPrefix(capnp *this,ArrayPtr<const_capnp::word> array)

{
  size_t sVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  
  if (array.ptr == (word *)0x0) {
    sVar1 = 1;
  }
  else {
    uVar2 = *(int *)this + 1;
    sVar1 = (size_t)((uVar2 >> 1) + 1);
    uVar4 = (long)array.ptr * 2 - 1;
    uVar3 = (ulong)uVar2;
    if (uVar4 < uVar2) {
      uVar3 = uVar4;
    }
    for (uVar4 = 0; uVar3 != uVar4; uVar4 = uVar4 + 1) {
      sVar1 = sVar1 + *(uint *)(this + uVar4 * 4 + 4);
    }
  }
  return sVar1;
}

Assistant:

size_t expectedSizeInWordsFromPrefix(kj::ArrayPtr<const word> array) {
  if (array.size() < 1) {
    // All messages are at least one word.
    return 1;
  }

  const _::WireValue<uint32_t>* table =
      reinterpret_cast<const _::WireValue<uint32_t>*>(array.begin());

  uint segmentCount = table[0].get() + 1;
  size_t offset = segmentCount / 2u + 1u;

  // If the array is too small to contain the full segment table, truncate segmentCount to just
  // what is available.
  segmentCount = kj::min(segmentCount, array.size() * 2 - 1u);

  size_t totalSize = offset;
  for (uint i = 0; i < segmentCount; i++) {
    totalSize += table[i + 1].get();
  }
  return totalSize;
}